

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition
          (MessageGenerator *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  long lVar3;
  bool need_to_emit_cached_size;
  _Any_data local_9c8;
  code *local_9b8;
  code *pcStack_9b0;
  allocator<char> local_99b;
  allocator<char> local_99a;
  allocator<char> local_999;
  allocator<char> local_998;
  allocator<char> local_997;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  undefined1 *local_990;
  undefined8 local_988;
  undefined1 local_980 [8];
  undefined8 uStack_978;
  undefined1 *local_970;
  undefined8 local_968;
  undefined1 local_960 [8];
  undefined8 uStack_958;
  undefined1 *local_950;
  undefined8 local_948;
  undefined1 local_940 [8];
  undefined8 uStack_938;
  undefined1 *local_930;
  undefined8 local_928;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined1 *local_910;
  undefined8 local_908;
  undefined1 local_900 [8];
  undefined8 uStack_8f8;
  undefined1 *local_8f0;
  undefined8 local_8e8;
  undefined1 local_8e0 [8];
  undefined8 uStack_8d8;
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined1 local_8c0 [8];
  undefined8 uStack_8b8;
  undefined1 *local_8b0;
  undefined8 local_8a8;
  undefined1 local_8a0 [8];
  undefined8 uStack_898;
  undefined1 *local_890;
  undefined8 local_888;
  undefined1 local_880 [8];
  undefined8 uStack_878;
  undefined1 *local_870;
  undefined8 local_868;
  undefined1 local_860 [8];
  undefined8 uStack_858;
  undefined1 *local_850;
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_848;
  undefined1 local_840 [8];
  undefined8 uStack_838;
  Printer *local_830;
  size_t sizeof_has_bits;
  Printer *p_local;
  undefined1 local_818 [64];
  char local_7d8;
  undefined1 *local_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0 [16];
  undefined1 local_7b0;
  undefined1 local_768;
  undefined1 *local_760;
  undefined8 local_758;
  undefined1 local_750 [8];
  undefined8 uStack_748;
  variant<std::__cxx11::string,std::function<bool()>> local_740 [32];
  char local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined1 local_708 [16];
  undefined1 local_6f8;
  undefined1 local_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698 [8];
  undefined8 uStack_690;
  variant<std::__cxx11::string,std::function<bool()>> local_688 [32];
  char local_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650 [16];
  undefined1 local_640;
  undefined1 local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  variant<std::__cxx11::string,std::function<bool()>> local_5d0 [32];
  char local_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588;
  undefined1 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  variant<std::__cxx11::string,std::function<bool()>> local_518 [32];
  char local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0;
  undefined1 local_488;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  variant<std::__cxx11::string,std::function<bool()>> local_460 [32];
  char local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  variant<std::__cxx11::string,std::function<bool()>> local_3a8 [32];
  char local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  need_to_emit_cached_size = !bVar2;
  sizeof_has_bits = (size_t)((this->max_has_bit_index_ + 0x1f) / 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"extension_set",&local_991);
  local_818._0_8_ = local_818 + 0x10;
  if (local_850 == local_840) {
    local_818._24_8_ = uStack_838;
  }
  else {
    local_818._0_8_ = local_850;
  }
  local_818._8_8_ =
       local_848.
       super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
       .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
       ._M_head_impl;
  local_848.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )(_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )0x0;
  local_840[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_850 = local_840;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_818 + 0x20),
             (function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_7d0 = local_7c0;
  local_7c8 = 0;
  local_7c0[0] = 0;
  local_7b0 = 0;
  if (local_7d8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_7d0);
  }
  local_768 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"tracker",&local_992);
  local_760 = local_750;
  if (local_870 == local_860) {
    uStack_748 = uStack_858;
  }
  else {
    local_760 = local_870;
  }
  local_758 = local_868;
  local_868 = 0;
  local_860[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_870 = local_860;
  local_830 = p;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_740,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_718 = local_708;
  local_710 = 0;
  local_708[0] = 0;
  local_6f8 = 0;
  if (local_720 == '\x01') {
    std::__cxx11::string::assign((char *)&local_718);
  }
  local_6b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,"inlined_string_donated",&local_993);
  local_6a8 = local_698;
  if (local_890 == local_880) {
    uStack_690 = uStack_878;
  }
  else {
    local_6a8 = local_890;
  }
  local_6a0 = local_888;
  local_888 = 0;
  local_880[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_890 = local_880;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_688,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_660 = local_650;
  local_658 = 0;
  local_650[0] = 0;
  local_640 = 0;
  if (local_668 == '\x01') {
    std::__cxx11::string::assign((char *)&local_660);
  }
  local_5f8 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"has_bits",&local_994);
  local_5f0 = local_5e0;
  if (local_8b0 == local_8a0) {
    uStack_5d8 = uStack_898;
  }
  else {
    local_5f0 = local_8b0;
  }
  local_5e8 = local_8a8;
  local_8a8 = 0;
  local_8a0[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_8b0 = local_8a0;
  local_9c8._M_unused._M_object = operator_new(0x28);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(size_t **)((long)local_9c8._M_unused._0_8_ + 0x10) = &sizeof_has_bits;
  *(bool **)((long)local_9c8._M_unused._0_8_ + 0x18) = &need_to_emit_cached_size;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x20) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_5d0,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_5a8 = local_598;
  local_5a0 = 0;
  local_598[0] = 0;
  local_588 = 0;
  if (local_5b0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_5a8);
  }
  local_540 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"field_members",&local_995);
  local_538 = local_528;
  if (local_8d0 == local_8c0) {
    uStack_520 = uStack_8b8;
  }
  else {
    local_538 = local_8d0;
  }
  local_530 = local_8c8;
  local_8c8 = 0;
  local_8c0[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_8d0 = local_8c0;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_518,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = 0;
  local_4d0 = 0;
  if (local_4f8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_4f0);
  }
  local_488 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"decl_split",&local_996);
  local_480 = local_470;
  if (local_8f0 == local_8e0) {
    uStack_468 = uStack_8d8;
  }
  else {
    local_480 = local_8f0;
  }
  local_478 = local_8e8;
  local_8e8 = 0;
  local_8e0[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_8f0 = local_8e0;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_460,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  if (local_440 == '\x01') {
    std::__cxx11::string::assign((char *)&local_438);
  }
  local_3d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"oneof_members",&local_997);
  local_3c8 = local_3b8;
  if (local_910 == local_900) {
    uStack_3b0 = uStack_8f8;
  }
  else {
    local_3c8 = local_910;
  }
  local_3c0 = local_908;
  local_908 = 0;
  local_900[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_910 = local_900;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_3a8,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  if (local_388 == '\x01') {
    std::__cxx11::string::assign((char *)&local_380);
  }
  local_318 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_930,"cached_size_if_no_hasbits",&local_998);
  local_310 = local_300;
  if (local_930 == local_920) {
    uStack_2f8 = uStack_918;
  }
  else {
    local_310 = local_930;
  }
  local_308 = local_928;
  local_928 = 0;
  local_920[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_930 = local_920;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(bool **)local_9c8._M_unused._0_8_ = &need_to_emit_cached_size;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_2f0,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_950,"oneof_case",&local_999);
  local_258 = local_248;
  if (local_950 == local_940) {
    uStack_240 = uStack_938;
  }
  else {
    local_258 = local_950;
  }
  local_250 = local_948;
  local_948 = 0;
  local_940[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_950 = local_940;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_238,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  if (local_218 == '\x01') {
    std::__cxx11::string::assign((char *)&local_210);
  }
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_970,"weak_field_map",&local_99a);
  local_1a0 = local_190;
  if (local_970 == local_960) {
    uStack_188 = uStack_958;
  }
  else {
    local_1a0 = local_970;
  }
  local_198 = local_968;
  local_968 = 0;
  local_960[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_970 = local_960;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"union_impl",&local_99b);
  pPVar1 = local_830;
  local_e8 = local_d8;
  if (local_990 == local_980) {
    uStack_d0 = uStack_978;
  }
  else {
    local_e8 = local_990;
  }
  local_e0 = local_988;
  local_988 = 0;
  local_980[0] = 0;
  local_9b8 = (code *)0x0;
  pcStack_9b0 = (code *)0x0;
  local_9c8._M_unused._M_object = (void *)0x0;
  local_9c8._8_8_ = 0;
  local_990 = local_980;
  local_9c8._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_9c8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_9c8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_9c8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9b0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_9c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(pPVar1,local_818,0xb,0x451,
                    "\n        struct Impl_ {\n          //~ TODO: check if/when there is a need for an\n          //~ outline dtor.\n          inline explicit constexpr Impl_($pbi$::ConstantInitialized) noexcept;\n          inline explicit Impl_(\n              //~\n              $pbi$::InternalVisibility visibility,\n              $pb$::Arena* $nullable$ arena);\n          inline explicit Impl_(\n              //~\n              $pbi$::InternalVisibility visibility,\n              $pb$::Arena* $nullable$ arena, const Impl_& from,\n              const $classname$& from_msg);\n          //~ Members assumed to align to 8 bytes:\n          $extension_set$;\n          $tracker$;\n          $inlined_string_donated$;\n          $has_bits$;\n          //~ Field members:\n          $field_members$;\n          $decl_split$;\n          $oneof_members$;\n          //~ Members assumed to align to 4 bytes:\n          $cached_size_if_no_hasbits$;\n          $oneof_case$;\n          $weak_field_map$;\n          //~ For detecting when concurrent accessor calls cause races.\n          PROTOBUF_TSAN_DECLARE_MEMBER\n        };\n        $union_impl$;\n      "
                   );
  lVar3 = 0x730;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_818 + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_850);
  if (need_to_emit_cached_size != true) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_818,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
             ,0x6a1,"!need_to_emit_cached_size");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_818);
}

Assistant:

void MessageGenerator::GenerateImplDefinition(io::Printer* p) {
  // Prepare decls for _cached_size_ and _has_bits_.  Their position in the
  // output will be determined later.
  bool need_to_emit_cached_size = !HasSimpleBaseClass(descriptor_, options_);
  const size_t sizeof_has_bits = HasBitsSize();

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.
  p->Emit(
      {{"extension_set",
        [&] {
          if (descriptor_->extension_range_count() == 0) return;

          p->Emit(R"cc(
            $pbi$::ExtensionSet _extensions_;
          )cc");
        }},
       {"tracker",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;

          p->Emit(R"cc(
            static $pb$::AccessListener<$Msg$> _tracker_;
            static void TrackerOnGetMetadata() { $annotate_reflection$; }
          )cc");
        }},
       {"inlined_string_donated",
        [&] {
          // Generate _inlined_string_donated_ for inlined string type.
          // TODO: To avoid affecting the locality of
          // `_has_bits_`, should this be below or above `_has_bits_`?
          if (inlined_string_indices_.empty()) return;

          p->Emit({{"donated_size", InlinedStringDonatedSize()}},
                  R"cc(
                    $pbi$::HasBits<$donated_size$> _inlined_string_donated_;
                  )cc");
        }},
       {"has_bits",
        [&] {
          if (has_bit_indices_.empty()) return;

          // _has_bits_ is frequently accessed, so to reduce code size and
          // improve speed, it should be close to the start of the object.
          // Placing _cached_size_ together with _has_bits_ improves cache
          // locality despite potential alignment padding.
          p->Emit({{"sizeof_has_bits", sizeof_has_bits}}, R"cc(
            $pbi$::HasBits<$sizeof_has_bits$> _has_bits_;
          )cc");
          if (need_to_emit_cached_size) {
            p->Emit(R"cc(
              $pbi$::CachedSize _cached_size_;
            )cc");
            need_to_emit_cached_size = false;
          }
        }},
       {"field_members",
        [&] {
          // Emit some private and static members
          for (auto field : optimized_order_) {
            field_generators_.get(field).GenerateStaticMembers(p);
            if (!ShouldSplit(field, options_)) {
              field_generators_.get(field).GeneratePrivateMembers(p);
            }
          }
        }},
       {"decl_split",
        [&] {
          if (!ShouldSplit(descriptor_, options_)) return;
          p->Emit({{"split_field",
                    [&] {
                      for (auto field : optimized_order_) {
                        if (!ShouldSplit(field, options_)) continue;
                        field_generators_.get(field).GeneratePrivateMembers(p);
                      }
                    }}},
                  R"cc(
                    struct Split {
                      $split_field$;
                      using InternalArenaConstructable_ = void;
                      using DestructorSkippable_ = void;
                    };
                    static_assert(::std::is_trivially_copy_constructible<Split>::value);
                    static_assert(::std::is_trivially_destructible<Split>::value);
                    Split* $nonnull$ _split_;
                  )cc");
        }},
       {"oneof_members",
        [&] {
          // For each oneof generate a union
          for (auto oneof : OneOfRange(descriptor_)) {
            // explicit empty constructor is needed when union contains
            // ArenaStringPtr members for string fields.
            p->Emit(
                {{"camel_oneof_name",
                  UnderscoresToCamelCase(oneof->name(), true)},
                 {"oneof_name", oneof->name()},
                 {"oneof_fields",
                  [&] {
                    for (auto field : FieldRange(oneof)) {
                      field_generators_.get(field).GeneratePrivateMembers(p);
                    }
                  }}},
                R"cc(
                  union $camel_oneof_name$Union {
                    constexpr $camel_oneof_name$Union() : _constinit_{} {}
                    $pbi$::ConstantInitialized _constinit_;
                    $oneof_fields$;
                  } $oneof_name$_;
                )cc");
            for (auto field : FieldRange(oneof)) {
              field_generators_.get(field).GenerateStaticMembers(p);
            }
          }
        }},
       {"cached_size_if_no_hasbits",
        [&] {
          if (!need_to_emit_cached_size) return;

          need_to_emit_cached_size = false;
          p->Emit(R"cc(
            $pbi$::CachedSize _cached_size_;
          )cc");
        }},
       {"oneof_case",
        [&] {
          // Generate _oneof_case_.
          if (descriptor_->real_oneof_decl_count() == 0) return;

          p->Emit({{"count", descriptor_->real_oneof_decl_count()}},
                  R"cc(
                    $uint32$ _oneof_case_[$count$];
                  )cc");
        }},
       {"weak_field_map",
        [&] {
          if (num_weak_fields_ == 0) return;

          p->Emit(R"cc(
            $pbi$::WeakFieldMap _weak_field_map_;
          )cc");
        }},
       {"union_impl",
        [&] {
          // Only create the _impl_ field if it contains data.
          if (!HasImplData(descriptor_, options_)) return;

          // clang-format off
            p->Emit(R"cc(union { Impl_ _impl_; };)cc");
          // clang-format on
        }}},
      R"cc(
        struct Impl_ {
          //~ TODO: check if/when there is a need for an
          //~ outline dtor.
          inline explicit constexpr Impl_($pbi$::ConstantInitialized) noexcept;
          inline explicit Impl_(
              //~
              $pbi$::InternalVisibility visibility,
              $pb$::Arena* $nullable$ arena);
          inline explicit Impl_(
              //~
              $pbi$::InternalVisibility visibility,
              $pb$::Arena* $nullable$ arena, const Impl_& from,
              const $classname$& from_msg);
          //~ Members assumed to align to 8 bytes:
          $extension_set$;
          $tracker$;
          $inlined_string_donated$;
          $has_bits$;
          //~ Field members:
          $field_members$;
          $decl_split$;
          $oneof_members$;
          //~ Members assumed to align to 4 bytes:
          $cached_size_if_no_hasbits$;
          $oneof_case$;
          $weak_field_map$;
          //~ For detecting when concurrent accessor calls cause races.
          PROTOBUF_TSAN_DECLARE_MEMBER
        };
        $union_impl$;
      )cc");

  ABSL_DCHECK(!need_to_emit_cached_size);
}